

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O2

Reader * __thiscall
capnproto_test::capnp::test::TestDefaults::Reader::getUInt8List
          (Reader *__return_storage_ptr__,Reader *this)

{
  bool bVar1;
  PointerReader local_28;
  
  bVar1 = 9 < (this->_reader).pointerCount;
  local_28.pointer = (WirePointer *)0x0;
  if (bVar1) {
    local_28.pointer = (this->_reader).pointers + 9;
  }
  local_28.nestingLimit = (this->_reader).nestingLimit;
  if (bVar1) {
    local_28.segment._0_4_ = *(undefined4 *)&(this->_reader).segment;
    local_28.segment._4_4_ = *(undefined4 *)((long)&(this->_reader).segment + 4);
    local_28.capTable._0_4_ = *(undefined4 *)&(this->_reader).capTable;
    local_28.capTable._4_4_ = *(undefined4 *)((long)&(this->_reader).capTable + 4);
  }
  else {
    local_28.segment._0_4_ = 0;
    local_28.segment._4_4_ = 0;
    local_28.capTable._0_4_ = 0;
    local_28.capTable._4_4_ = 0;
    local_28.nestingLimit = 0x7fffffff;
  }
  ::capnp::List<unsigned_char,_(capnp::Kind)0>::getFromPointer
            (&__return_storage_ptr__->reader,&local_28,(word *)&DAT_00291a70);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::List< ::uint8_t,  ::capnp::Kind::PRIMITIVE>::Reader TestDefaults::Reader::getUInt8List() const {
  return ::capnp::_::PointerHelpers< ::capnp::List< ::uint8_t,  ::capnp::Kind::PRIMITIVE>>::get(_reader.getPointerField(
      ::capnp::bounded<9>() * ::capnp::POINTERS),
        ::capnp::schemas::bp_eb3f9ebe98c73cb6 + 715);
}